

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O2

string * bgui::(anonymous_namespace)::createHelpText_abi_cxx11_(void)

{
  string *in_RDI;
  ostringstream out;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::operator<<((ostream *)aoStack_188,"Usage and Keycodes:\n");
  std::operator<<((ostream *)aoStack_188,"\n");
  std::operator<<((ostream *)aoStack_188,"left mouse click and moving for panning\n");
  std::operator<<((ostream *)aoStack_188,
                  "right mouse click (or shift and left mouse click) for pixel information\n");
  std::operator<<((ostream *)aoStack_188,"mouse wheel for zooming\n");
  std::operator<<((ostream *)aoStack_188,"\n");
  std::operator<<((ostream *)aoStack_188,"Information and Exit:\n");
  std::operator<<((ostream *)aoStack_188,"\'h\'            Shows this help text.\n");
  std::operator<<((ostream *)aoStack_188,"\'v\'            Shows version information.\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'i\'            Shows information about the currently viewed image part.\n");
  std::operator<<((ostream *)aoStack_188,"\'q\', \'esc\'     Exit\n");
  std::operator<<((ostream *)aoStack_188,"\n");
  std::operator<<((ostream *)aoStack_188,"Select color channel:\n");
  std::operator<<((ostream *)aoStack_188,"\'C\'            Reset color channel selection.\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'R\', \'G\', \'B\'  Shows only the corresponding color channel.\n");
  std::operator<<((ostream *)aoStack_188,"\n");
  std::operator<<((ostream *)aoStack_188,"Size and Orientation:\n");
  std::operator<<((ostream *)aoStack_188,"\'0\'            (Re)set zoom factor to 1.\n");
  std::operator<<((ostream *)aoStack_188,"\'+\', \'-\'       Zooming in and out.\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'s\'            Resize window to size of image at current scaling\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'r\', \'l\'       Rotate anti-clockwise or clockwise by 90 degrees\n");
  std::operator<<((ostream *)aoStack_188,"\'f\'            Flip image horizontally.\n");
  std::operator<<((ostream *)aoStack_188,"\n");
  std::operator<<((ostream *)aoStack_188,"Radiometry:\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'t\'            Switches smoothing by trilinear filtering on or off.\n");
  std::operator<<((ostream *)aoStack_188,
                  "\'a\'            Scale such that currently visible part of the image uses full contrast\n"
                 );
  std::operator<<((ostream *)aoStack_188,
                  "\'b\', \'w\'       Scale such that pixel at current mouse position is black or white\n"
                 );
  std::operator<<((ostream *)aoStack_188,
                  "\'m\'            Switching between raw, jet and rainbow mapping for greyscale images\n"
                 );
  std::operator<<((ostream *)aoStack_188,
                  "\'1\', \'2\', \'4\'  Setting the corresponding value as gamma factor\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return in_RDI;
}

Assistant:

std::string createHelpText()
{
  std::ostringstream out;

  out << "Usage and Keycodes:\n";
  out << "\n";
  out << "left mouse click and moving for panning\n";
  out << "right mouse click (or shift and left mouse click) for pixel information\n";
  out << "mouse wheel for zooming\n";
  out << "\n";
  out << "Information and Exit:\n";
  out << "'h'            Shows this help text.\n";
  out << "'v'            Shows version information.\n";
  out << "'i'            Shows information about the currently viewed image part.\n";
  out << "'q', 'esc'     Exit\n";
  out << "\n";
  out << "Select color channel:\n";
  out << "'C'            Reset color channel selection.\n";
  out << "'R', 'G', 'B'  Shows only the corresponding color channel.\n";
  out << "\n";
  out << "Size and Orientation:\n";
  out << "'0'            (Re)set zoom factor to 1.\n";
  out << "'+', '-'       Zooming in and out.\n";
  out << "'s'            Resize window to size of image at current scaling\n";
  out << "'r', 'l'       Rotate anti-clockwise or clockwise by 90 degrees\n";
  out << "'f'            Flip image horizontally.\n";
  out << "\n";
  out << "Radiometry:\n";
  out << "'t'            Switches smoothing by trilinear filtering on or off.\n";
  out << "'a'            Scale such that currently visible part of the image uses full contrast\n";
  out << "'b', 'w'       Scale such that pixel at current mouse position is black or white\n";
  out << "'m'            Switching between raw, jet and rainbow mapping for greyscale images\n";
  out << "'1', '2', '4'  Setting the corresponding value as gamma factor\n";

  return out.str();
}